

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

BOOL __thiscall GlobOpt::PRE::PreloadPRECandidate(PRE *this,Loop *loop,GlobHashBucket *candidate)

{
  StackSym *sym;
  SymIdToInstrMap *pSVar1;
  Type piVar2;
  code *pcVar3;
  Value *this_00;
  Sym *pSVar4;
  PropertySym *pPVar5;
  bool bVar6;
  BOOLEAN BVar7;
  uint uVar8;
  uint uVar9;
  undefined4 *puVar10;
  Instr *pIVar11;
  RegOpnd *newDst;
  Value *pVVar12;
  PropertySym *pPVar13;
  ProfiledInstr *pPVar14;
  JITTimeFunctionBody *pJVar15;
  FunctionJITTimeInfo *pFVar16;
  BasicBlock *pBVar17;
  char16_t *reason;
  Type this_01;
  BVSparse<Memory::JitArenaAllocator> *this_02;
  uint uVar18;
  Loop *pLVar19;
  Value *local_88;
  Value *initialValue;
  StackSym *local_78;
  BasicBlock *local_70;
  Value *local_68;
  StackSym *local_60;
  Sym *objPtrCopyPropSym;
  Loop *local_50;
  PropertySym *local_48;
  PropertySym *propertySym;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType valueType;
  
  pPVar13 = (PropertySym *)candidate->value;
  local_50 = loop;
  if ((pPVar13->super_Sym).m_kind != SymKindProperty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
    if (!bVar6) goto LAB_004473dc;
    *puVar10 = 0;
  }
  local_48 = pPVar13;
  BVar7 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                    (this->candidates->candidatesToProcess,(pPVar13->super_Sym).m_id);
  pLVar19 = local_50;
  if (BVar7 == '\0') {
    return 0;
  }
  objPtrCopyPropSym = (Sym *)candidate->element;
  sym = local_48->m_stackSym;
  local_60 = (StackSym *)0x0;
  bVar6 = GlobOptBlockData::IsLive(&local_50->landingPad->globOptData,&sym->super_Sym);
  if (!bVar6) {
    pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->globOpt->func->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar15);
    pFVar16 = JITTimeWorkItem::GetJITTimeInfo(this->globOpt->func->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar16);
    bVar6 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015bbe90,MakeObjSymLiveInLandingPadPhase,uVar8,uVar9);
    pLVar19 = local_50;
    if (bVar6) {
      return 0;
    }
    if (((sym->field_0x18 & 1) == 0) || ((sym->field_5).m_instrDef == (Instr *)0x0)) {
      reason = L"Object sym not live in landing pad and not single-def";
LAB_00446ec2:
      TraceFailedPreloadInLandingPad(this,pLVar19,local_48,reason);
      return 0;
    }
    bVar6 = InsertSymDefinitionInLandingPad(this,sym,local_50,(Sym **)&local_60);
    if (!bVar6) {
      reason = L"Failed to insert load of object sym in landing pad";
      goto LAB_00446ec2;
    }
  }
  local_78 = sym;
  bVar6 = GlobOptBlockData::IsLive(&pLVar19->landingPad->globOptData,&sym->super_Sym);
  if (!bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3f5,"(loop->landingPad->globOptData.IsLive(objPtrSym))",
                       "loop->landingPad->globOptData.IsLive(objPtrSym)");
    if (!bVar6) goto LAB_004473dc;
    *puVar10 = 0;
  }
  pBVar17 = pLVar19->landingPad;
  pPVar13 = *(PropertySym **)&objPtrCopyPropSym->m_next->m_id;
  if ((pPVar13 == (PropertySym *)0x0) || ((pPVar13->super_Sym).m_kind != SymKindStack)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3fc,"(symStore && symStore->IsStackSym())",
                       "symStore && symStore->IsStackSym()");
    if (!bVar6) goto LAB_004473dc;
    *puVar10 = 0;
  }
  bVar6 = GlobOptBlockData::IsLive(&pLVar19->landingPad->globOptData,&pPVar13->super_Sym);
  if (bVar6) {
    return 0;
  }
  initialValue = (Value *)&pBVar17->globOptData;
  local_68 = GlobOptBlockData::FindValue((GlobOptBlockData *)initialValue,&local_48->super_Sym);
  if (local_68 == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x408,"(landingPadValue)","landingPadValue");
    if (!bVar6) goto LAB_004473dc;
    *puVar10 = 0;
  }
  pPVar5 = local_48;
  pSVar1 = this->globOpt->prePassInstrMap;
  piVar2 = pSVar1->buckets;
  uVar8 = 0;
  local_70 = pBVar17;
  propertySym = pPVar13;
  if (piVar2 != (Type)0x0) {
    uVar8 = JsUtil::
            BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket((local_48->super_Sym).m_id * 2 + 1,pSVar1->bucketCount,
                        pSVar1->modFunctionIndex);
    uVar18 = piVar2[uVar8];
    uVar8 = 0;
    if (-1 < (int)uVar18) {
      uVar8 = 0;
      do {
        if (pSVar1->entries[uVar18].
            super_DefaultHashedEntry<unsigned_int,_IR::Instr_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_int,_IR::Instr_*>.
            super_ValueEntry<IR::Instr_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_IR::Instr_*>_>
            .super_KeyValueEntryDataLayout2<unsigned_int,_IR::Instr_*>.key ==
            (pPVar5->super_Sym).m_id) {
          this_01 = pSVar1->stats;
          goto LAB_00446de3;
        }
        uVar8 = uVar8 + 1;
        uVar18 = pSVar1->entries[uVar18].
                 super_DefaultHashedEntry<unsigned_int,_IR::Instr_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .super_KeyValueEntry<unsigned_int,_IR::Instr_*>.
                 super_ValueEntry<IR::Instr_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_IR::Instr_*>_>
                 .super_KeyValueEntryDataLayout2<unsigned_int,_IR::Instr_*>.next;
      } while (-1 < (int)uVar18);
    }
  }
  this_01 = pSVar1->stats;
  uVar18 = 0xffffffff;
LAB_00446de3:
  if (this_01 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_01,uVar8);
  }
  pLVar19 = local_50;
  if ((int)uVar18 < 0) {
    pIVar11 = (Instr *)0x0;
  }
  else {
    pIVar11 = pSVar1->entries[uVar18].
              super_DefaultHashedEntry<unsigned_int,_IR::Instr_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
              .super_KeyValueEntry<unsigned_int,_IR::Instr_*>.
              super_ValueEntry<IR::Instr_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_IR::Instr_*>_>
              .super_KeyValueEntryDataLayout2<unsigned_int,_IR::Instr_*>.value;
  }
  if (pIVar11 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x40b,"(ldInstrInLoop)","ldInstrInLoop");
    if (!bVar6) goto LAB_004473dc;
    *puVar10 = 0;
  }
  if (pIVar11->m_dst != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x40c,"(ldInstrInLoop->GetDst() == nullptr)",
                       "ldInstrInLoop->GetDst() == nullptr");
    if (!bVar6) goto LAB_004473dc;
    *puVar10 = 0;
  }
  pPVar13 = propertySym;
  bVar6 = IsPREInstrCandidateLoad(pIVar11->m_opcode);
  if (!bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x40f,"(IsPREInstrCandidateLoad(ldInstrInLoop->m_opcode))",
                       "IsPREInstrCandidateLoad(ldInstrInLoop->m_opcode)");
    if (!bVar6) goto LAB_004473dc;
    *puVar10 = 0;
    pPVar13 = propertySym;
  }
  pIVar11 = InsertPropertySymPreloadInLandingPad(this,pIVar11,pLVar19,local_48);
  if (pIVar11 == (Instr *)0x0) {
    return 0;
  }
  if (pIVar11->m_dst != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x417,"(ldInstr->GetDst() == nullptr)","ldInstr->GetDst() == nullptr");
    if (!bVar6) goto LAB_004473dc;
    *puVar10 = 0;
    pPVar13 = propertySym;
  }
  if ((pPVar13->super_Sym).m_kind != SymKindStack) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar6) goto LAB_004473dc;
    *puVar10 = 0;
    pPVar13 = propertySym;
  }
  newDst = IR::RegOpnd::New((StackSym *)pPVar13,TyVar,this->globOpt->func);
  IR::Instr::SetDst(pIVar11,&newDst->super_Opnd);
  BVSparse<Memory::JitArenaAllocator>::Set(pLVar19->fieldPRESymStores,(pPVar13->super_Sym).m_id);
  BVSparse<Memory::JitArenaAllocator>::Set
            ((local_70->globOptData).liveVarSyms,(pPVar13->super_Sym).m_id);
  this_00 = initialValue;
  pVVar12 = GlobOptBlockData::FindValue((GlobOptBlockData *)initialValue,&local_78->super_Sym);
  if (local_60 == (StackSym *)0x0) {
    if (pVVar12 == (Value *)0x0) {
      local_60 = (StackSym *)0x0;
    }
    else {
      local_60 = GlobOptBlockData::GetCopyPropSym
                           ((GlobOptBlockData *)this_00,&local_78->super_Sym,pVVar12);
    }
  }
  if (local_60 != (StackSym *)0x0) {
    pPVar13 = PropertySym::FindOrCreate
                        ((local_60->super_Sym).m_id,local_48->m_propertyId,
                         local_48->m_propertyIdIndex,local_48->m_inlineCacheIndex,
                         (local_48->super_Sym).field_0x15,this->globOpt->func);
    pVVar12 = GlobOptBlockData::FindValue((GlobOptBlockData *)this_00,&pPVar13->super_Sym);
    if (pVVar12 == (Value *)0x0) {
      GlobOptBlockData::SetValue((GlobOptBlockData *)this_00,local_68,&pPVar13->super_Sym);
      this_02 = (local_70->globOptData).liveFields;
      BVSparse<Memory::JitArenaAllocator>::Set(this_02,(pPVar13->super_Sym).m_id);
      MakePropertySymLiveOnBackEdges((PRE *)this_02,pPVar13,pLVar19,(Value *)objPtrCopyPropSym);
    }
  }
  local_32[0].field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
  local_88 = (Value *)0x0;
  bVar6 = JsUtil::
          BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<PropertySym*>
                    ((BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&pLVar19->initialValueFieldMap,&local_48,&local_88);
  pSVar4 = objPtrCopyPropSym;
  if (bVar6) {
    if (pIVar11->m_kind == InstrKindProfiled) {
      if (local_88->valueNumber == *(ValueNumber *)&objPtrCopyPropSym->_vptr_Sym) {
        bVar6 = ValueType::IsUninitialized((ValueType *)&objPtrCopyPropSym->m_next->m_next);
        if (bVar6) {
          pPVar14 = IR::Instr::AsProfiledInstr(pIVar11);
          local_32[0] = (anon_union_2_4_ea848c7b_for_ValueType_13)
                        (pPVar14->u).field_3.fldInfoData.f1;
        }
        else {
          local_32[0] = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&pSVar4->m_next->m_next;
        }
      }
      else {
        local_32[0].field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
      }
      if (pIVar11->m_kind != InstrKindProfiled) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
        if (!bVar6) {
LAB_004473dc:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar10 = 0;
      }
      *(anon_union_2_4_ea848c7b_for_ValueType_13 *)(pIVar11 + 1) = local_32[0];
    }
  }
  else {
    local_32[0] = (local_68->valueInfo->super_ValueType).field_0;
  }
  pPVar13 = propertySym;
  BVSparse<Memory::JitArenaAllocator>::Set
            (pLVar19->symsUsedBeforeDefined,(propertySym->super_Sym).m_id);
  bVar6 = ValueType::IsLikelyNumber((ValueType *)&local_32[0].field_0);
  if (bVar6) {
    BVSparse<Memory::JitArenaAllocator>::Set
              (pLVar19->likelyNumberSymsUsedBeforeDefined,(pPVar13->super_Sym).m_id);
    if ((this->globOpt->field_0xf5 & 2) == 0) {
      bVar6 = ValueType::IsInt((ValueType *)&local_32[0].field_0);
    }
    else {
      bVar6 = ValueType::IsLikelyInt((ValueType *)&local_32[0].field_0);
    }
    if (bVar6 != false) {
      BVSparse<Memory::JitArenaAllocator>::Set
                (pLVar19->likelyIntSymsUsedBeforeDefined,(pPVar13->super_Sym).m_id);
    }
  }
  pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->globOpt->func->m_workItem);
  uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar15);
  pFVar16 = JITTimeWorkItem::GetJITTimeInfo(this->globOpt->func->m_workItem);
  uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar16);
  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,FieldPREPhase,uVar8,uVar9);
  if (bVar6) {
    pBVar17 = Loop::GetHeadBlock(pLVar19);
    Output::Print(L"** TRACE: Field PRE: field pre-loaded in landing pad of loop head #%-3d: ",
                  (ulong)pBVar17->number);
    IR::Instr::Dump(pIVar11);
    Output::Print(L"\n");
    Output::Flush();
  }
  return 1;
}

Assistant:

BOOL GlobOpt::PRE::PreloadPRECandidate(Loop *loop, GlobHashBucket* candidate)
{
    // Insert a load for each field PRE candidate.
    PropertySym *propertySym = candidate->value->AsPropertySym();
    if (!candidates->candidatesToProcess->TestAndClear(propertySym->m_id))
    {
        return false;
    }
    Value * propSymValueOnBackEdge = candidate->element;

    StackSym *objPtrSym = propertySym->m_stackSym;
    Sym * objPtrCopyPropSym = nullptr;

    if (!loop->landingPad->globOptData.IsLive(objPtrSym))
    {
        if (PHASE_OFF(Js::MakeObjSymLiveInLandingPadPhase, this->globOpt->func))
        {
            return false;
        }
        if (objPtrSym->IsSingleDef())
        {
            // We can still try to do PRE if the object sym is single def, even if its not live in the landing pad.
            // We'll have to add a def instruction for the object sym in the landing pad, and then we can continue
            // pre-loading the current PRE candidate.
            // Case in point:
            // $L1            
            //                value|symStore
            //      t1 = o.x    (v1|t3)
            //      t2 = t1.y   (v2|t4) <-- t1 is not live in the loop landing pad
            //      jmp $L1

            if (!InsertSymDefinitionInLandingPad(objPtrSym, loop, &objPtrCopyPropSym))
            {
#if DBG_DUMP
                TraceFailedPreloadInLandingPad(loop, propertySym, _u("Failed to insert load of object sym in landing pad"));
#endif
                return false;
            }
        }
        else
        {
#if DBG_DUMP
            TraceFailedPreloadInLandingPad(loop, propertySym, _u("Object sym not live in landing pad and not single-def"));
#endif
            return false;
        }
    }
    Assert(loop->landingPad->globOptData.IsLive(objPtrSym));

    BasicBlock *landingPad = loop->landingPad;
    Sym *symStore = propSymValueOnBackEdge->GetValueInfo()->GetSymStore();

    // The symStore can't be live into the loop
    // The symStore needs to still have the same value
    Assert(symStore && symStore->IsStackSym());

    if (loop->landingPad->globOptData.IsLive(symStore))
    {
        // May have already been hoisted:
        //  o.x = t1;
        //  o.y = t1;
        return false;
    }
    Value *landingPadValue = landingPad->globOptData.FindValue(propertySym);

    // Value should be added as initial value or already be there.
    Assert(landingPadValue);

    IR::Instr * ldInstrInLoop = this->globOpt->prePassInstrMap->Lookup(propertySym->m_id, nullptr);
    Assert(ldInstrInLoop);
    Assert(ldInstrInLoop->GetDst() == nullptr);

    // Create instr to put in landing pad for compensation
    Assert(IsPREInstrCandidateLoad(ldInstrInLoop->m_opcode));

    IR::Instr * ldInstr = InsertPropertySymPreloadInLandingPad(ldInstrInLoop, loop, propertySym);
    if (!ldInstr)
    {
        return false;
    }

    Assert(ldInstr->GetDst() == nullptr);
    ldInstr->SetDst(IR::RegOpnd::New(symStore->AsStackSym(), TyVar, this->globOpt->func));
    loop->fieldPRESymStores->Set(symStore->m_id);
    landingPad->globOptData.liveVarSyms->Set(symStore->m_id);

    Value * objPtrValue = landingPad->globOptData.FindValue(objPtrSym);

    objPtrCopyPropSym = objPtrCopyPropSym ? objPtrCopyPropSym : objPtrValue ? landingPad->globOptData.GetCopyPropSym(objPtrSym, objPtrValue) : nullptr;
    if (objPtrCopyPropSym)
    {
        // If we inserted T4 = T1.y, and T3 is the copy prop sym for T1 in the landing pad, we need T3.y 
        // to be live on back edges to have the merge produce a value for T3.y. Having a value for T1.y 
        // produced from the merge is not enough as the T1.y in the loop will get obj-ptr-copy-propped to 
        // T3.y

        // T3.y
        PropertySym *newPropSym = PropertySym::FindOrCreate(
            objPtrCopyPropSym->m_id, propertySym->m_propertyId, propertySym->GetPropertyIdIndex(), propertySym->GetInlineCacheIndex(), propertySym->m_fieldKind, this->globOpt->func);

        if (!landingPad->globOptData.FindValue(newPropSym))
        {
            landingPad->globOptData.SetValue(landingPadValue, newPropSym);
            landingPad->globOptData.liveFields->Set(newPropSym->m_id);
            MakePropertySymLiveOnBackEdges(newPropSym, loop, propSymValueOnBackEdge);
        }
    }

    ValueType valueType(ValueType::Uninitialized);
    Value *initialValue = nullptr;

    if (loop->initialValueFieldMap.TryGetValue(propertySym, &initialValue))
    {
        if (ldInstr->IsProfiledInstr())
        {
            if (initialValue->GetValueNumber() == propSymValueOnBackEdge->GetValueNumber())
            {
                if (propSymValueOnBackEdge->GetValueInfo()->IsUninitialized())
                {
                    valueType = ldInstr->AsProfiledInstr()->u.FldInfo().valueType;
                }
                else
                {
                    valueType = propSymValueOnBackEdge->GetValueInfo()->Type();
                }
            }
            else
            {
                valueType = ValueType::Uninitialized;
            }
            ldInstr->AsProfiledInstr()->u.FldInfo().valueType = valueType;
        }
    }
    else
    {
        valueType = landingPadValue->GetValueInfo()->Type();
    }

    loop->symsUsedBeforeDefined->Set(symStore->m_id);

    if (valueType.IsLikelyNumber())
    {
        loop->likelyNumberSymsUsedBeforeDefined->Set(symStore->m_id);
        if (globOpt->DoAggressiveIntTypeSpec() ? valueType.IsLikelyInt() : valueType.IsInt())
        {
            // Can only force int conversions in the landing pad based on likely-int values if aggressive int type
            // specialization is enabled
            loop->likelyIntSymsUsedBeforeDefined->Set(symStore->m_id);
        }
    }

#if DBG_DUMP
    if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::FieldPREPhase, this->globOpt->func->GetSourceContextId(), this->globOpt->func->GetLocalFunctionId()))
    {
        Output::Print(_u("** TRACE: Field PRE: field pre-loaded in landing pad of loop head #%-3d: "), loop->GetHeadBlock()->GetBlockNum());
        ldInstr->Dump();
        Output::Print(_u("\n"));
        Output::Flush();
    }
#endif

    return true;
}